

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diyfp.h
# Opt level: O2

DiyFp rapidjson::internal::GetCachedPower10(int exp,int *outExp)

{
  RapidJSONException *this;
  DiyFp DVar1;
  
  if (-0x15d < exp) {
    *outExp = (exp + 0x15cU & 0xfffffff8) - 0x15c;
    DVar1 = GetCachedPowerByIndex((ulong)(exp + 0x15cU >> 3));
    return DVar1;
  }
  this = (RapidJSONException *)__cxa_allocate_exception(0x10);
  cereal::RapidJSONException::RapidJSONException
            (this,"rapidjson internal assertion failure: exp >= -348");
  __cxa_throw(this,&cereal::RapidJSONException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline DiyFp GetCachedPower10(int exp, int *outExp) {
    CEREAL_RAPIDJSON_ASSERT(exp >= -348);
    unsigned index = static_cast<unsigned>(exp + 348) / 8u;
    *outExp = -348 + static_cast<int>(index) * 8;
    return GetCachedPowerByIndex(index);
}